

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

Expression *
slang::ast::ForeachLoopStatement::buildLoopDims
          (ForeachLoopListSyntax *loopList,ASTContext *context,
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *dims)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  TempVarSymbol *pTVar2;
  SyntaxNode *this;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  Diagnostic *pDVar6;
  Type *this_01;
  _Storage<slang::ConstantRange,_true> _Var7;
  Type *pTVar8;
  size_t __n;
  Type **ppTVar9;
  IteratorSymbol *pIVar10;
  DiagCode code;
  ulong uVar11;
  long lVar12;
  SourceRange SVar13;
  string_view name;
  Token idName;
  LoopDim local_a8;
  Compilation *local_90;
  Symbol *local_88;
  ulong local_80;
  Token local_78;
  Type **local_68;
  Type **local_60;
  SyntaxNode *local_58;
  ASTContext *local_50;
  Type *local_48;
  SyntaxNode *local_40;
  SourceLocation local_38;
  Expression *this_00;
  
  local_90 = ((context->scope).ptr)->compilation;
  iVar4 = Expression::bind((int)(loopList->arrayName).ptr,(sockaddr *)context,0);
  this_00 = (Expression *)CONCAT44(extraout_var,iVar4);
  bVar3 = Expression::bad(this_00);
  if (bVar3) {
    uVar11 = (loopList->loopVariables).elements._M_extent._M_extent_value + 1;
    if (1 < uVar11) {
      uVar11 = uVar11 >> 1;
      lVar12 = 0;
      do {
        ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((loopList->loopVariables).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar12));
        pSVar1 = *ppSVar5;
        if (pSVar1->kind == IdentifierName) {
          local_78._0_8_ = *(undefined8 *)(pSVar1 + 1);
          local_78.info = (Info *)pSVar1[1].parent;
          local_a8._0_16_ = parsing::Token::valueText(&local_78);
          local_38 = parsing::Token::location(&local_78);
          local_a8.loopVar =
               BumpAllocator::
               emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                         (&local_90->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,&local_38,
                          local_90->errorType,local_90->errorType);
          pTVar2 = context->firstTempVar;
          context->firstTempVar = &(local_a8.loopVar)->super_TempVarSymbol;
          ((local_a8.loopVar)->super_TempVarSymbol).nextTemp = pTVar2;
          local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = false;
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
          emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,&local_a8);
        }
        lVar12 = lVar12 + 0x30;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  else {
    this_01 = (this_00->type).ptr;
    local_88 = Expression::getSymbolReference(this_00,true);
    if ((local_88 != (Symbol *)0x0) && (bVar3 = Type::isIterable(this_01), bVar3)) {
      uVar11 = (loopList->loopVariables).elements._M_extent._M_extent_value + 1;
      if (uVar11 < 2) {
        return this_00;
      }
      uVar11 = uVar11 >> 1;
      local_60 = &local_90->intType;
      local_68 = &local_90->errorType;
      local_40 = &(loopList->loopVariables).super_SyntaxListBase.super_SyntaxNode;
      lVar12 = 0;
      local_80 = 0;
      local_50 = context;
      do {
        ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((loopList->loopVariables).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar12));
        if (this_01 == (Type *)0x0) {
LAB_004428b5:
          SVar13 = slang::syntax::SyntaxNode::sourceRange(local_40);
          pDVar6 = ASTContext::addDiag(context,(DiagCode)0x4e0008,SVar13);
          ast::operator<<(pDVar6,(this_00->type).ptr);
          iVar4 = 1;
        }
        else {
          this = *ppSVar5;
          if (this_01->canonical == (Type *)0x0) {
            Type::resolveCanonical(this_01);
            context = local_50;
          }
          if ((this_01->canonical->super_Symbol).kind == ScalarType) goto LAB_004428b5;
          bVar3 = Type::hasFixedRange(this_01);
          if (bVar3) {
            _Var7._M_value = Type::getFixedRange(this_01);
            local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged = true;
            local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value = _Var7._M_value;
            local_a8.loopVar = (IteratorSymbol *)0x0;
            SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
            emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,&local_a8);
          }
          else {
            SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>(dims);
          }
          pTVar8 = Type::getArrayElementType(this_01);
          if (this->kind == EmptyIdentifierName) {
            iVar4 = 5;
            local_80 = CONCAT71((int7)((ulong)this >> 8),1);
            this_01 = pTVar8;
          }
          else {
            local_58 = this + 1;
            local_48 = pTVar8;
            local_a8._0_16_ = parsing::Token::valueText((Token *)local_58);
            __n = local_a8.range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
            if ((dims->data_[dims->len - 1].range.
                 super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ConstantRange>._M_engaged == false) &&
               ((local_80 & 1) != 0)) {
              SVar13 = slang::syntax::SyntaxNode::sourceRange(this);
              code.subsystem = Statements;
              code.code = 0x1a;
            }
            else {
              if ((__n != (local_88->name)._M_len) ||
                 ((__n != 0 &&
                  (iVar4 = bcmp(local_a8._8_8_,(local_88->name)._M_str,__n), iVar4 != 0)))) {
                if (this_01->canonical == (Type *)0x0) {
                  Type::resolveCanonical(this_01);
                }
                ppTVar9 = local_60;
                if ((this_01->canonical->super_Symbol).kind == AssociativeArrayType) {
                  pTVar8 = Type::getAssociativeIndexType(this_01);
                  if (pTVar8 == (Type *)0x0) {
                    SVar13 = slang::syntax::SyntaxNode::sourceRange(this);
                    pDVar6 = ASTContext::addDiag(context,(DiagCode)0x1b0008,SVar13);
                    SVar13 = slang::syntax::SyntaxNode::sourceRange
                                       ((SyntaxNode *)(loopList->arrayName).ptr);
                    Diagnostic::operator<<(pDVar6,SVar13);
                    ppTVar9 = local_68;
                    goto LAB_00442a5c;
                  }
                }
                else {
LAB_00442a5c:
                  pTVar8 = *ppTVar9;
                }
                local_78._0_8_ = parsing::Token::location((Token *)local_58);
                pIVar10 = BumpAllocator::
                          emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                                    (&local_90->super_BumpAllocator,
                                     (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,
                                     (SourceLocation *)&local_78,this_01,pTVar8);
                pTVar2 = context->firstTempVar;
                context->firstTempVar = &pIVar10->super_TempVarSymbol;
                (pIVar10->super_TempVarSymbol).nextTemp = pTVar2;
                dims->data_[dims->len - 1].loopVar = pIVar10;
                iVar4 = 0;
                this_01 = local_48;
                goto LAB_004428e6;
              }
              SVar13 = slang::syntax::SyntaxNode::sourceRange(this);
              code.subsystem = Statements;
              code.code = 0x2b;
            }
            pDVar6 = ASTContext::addDiag(context,code,SVar13);
            Diagnostic::operator<<(pDVar6,(string_view)local_a8._0_16_);
            iVar4 = 1;
            this_01 = local_48;
          }
        }
LAB_004428e6:
        if ((iVar4 != 5) && (iVar4 != 0)) {
          return (Expression *)0x0;
        }
        lVar12 = lVar12 + 0x30;
        uVar11 = uVar11 - 1;
        if (uVar11 == 0) {
          return this_00;
        }
      } while( true );
    }
    ASTContext::addDiag(context,(DiagCode)0x300008,this_00->sourceRange);
  }
  return (Expression *)0x0;
}

Assistant:

const Expression* ForeachLoopStatement::buildLoopDims(const ForeachLoopListSyntax& loopList,
                                                      ASTContext& context,
                                                      SmallVectorBase<LoopDim>& dims) {
    // Find the array over which we are looping. Make sure it's actually iterable:
    // - Must be a referenceable variable, class property, etc.
    // - Type can be:
    //    - Any kind of array
    //    - Any multi-dimensional integral type
    //    - A string
    auto& comp = context.getCompilation();
    auto& arrayRef = Expression::bind(*loopList.arrayName, context);
    if (arrayRef.bad()) {
        // Create placeholder iterator symbols to prevent downstream errors.
        for (auto loopVar : loopList.loopVariables) {
            if (loopVar->kind == SyntaxKind::IdentifierName) {
                auto idName = loopVar->as<IdentifierNameSyntax>().identifier;
                auto it = comp.emplace<IteratorSymbol>(idName.valueText(), idName.location(),
                                                       comp.getErrorType(), comp.getErrorType());
                it->nextTemp = std::exchange(context.firstTempVar, it);
                dims.push_back({std::nullopt, it});
            }
        }
        return nullptr;
    }

    const Type* type = arrayRef.type;
    auto arraySym = arrayRef.getSymbolReference();
    if (!arraySym || !type->isIterable()) {
        context.addDiag(diag::NotAnArray, arrayRef.sourceRange);
        return nullptr;
    }

    // Build iterator symbols for each loop variable.
    bool skippedAny = false;
    for (auto loopVar : loopList.loopVariables) {
        // If type is null, we've run out of dimensions so there were too many
        // loop variables supplied.
        if (!type || type->isScalar()) {
            context.addDiag(diag::TooManyForeachVars, loopList.loopVariables.sourceRange())
                << *arrayRef.type;
            return nullptr;
        }

        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        const Type& currType = *type;
        type = type->getArrayElementType();

        // Empty iterator names indicate that we skip this dimension.
        if (loopVar->kind == SyntaxKind::EmptyIdentifierName) {
            skippedAny = true;
            continue;
        }

        auto& idName = loopVar->as<IdentifierNameSyntax>();
        std::string_view name = idName.identifier.valueText();

        // If we previously had skipped dimensions this one can't be dynamically
        // sized (there would be no way to reach it during iteration).
        if (!dims.back().range && skippedAny) {
            context.addDiag(diag::ForeachDynamicDimAfterSkipped, idName.sourceRange()) << name;
            return nullptr;
        }

        if (name == arraySym->name) {
            context.addDiag(diag::LoopVarShadowsArray, loopVar->sourceRange()) << name;
            return nullptr;
        }

        // The type of the iterator is typically an int, unless this dimension
        // is an associative array in which case it's the index type.
        const Type* indexType;
        if (currType.isAssociativeArray()) {
            indexType = currType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::ForeachWildcardIndex, loopVar->sourceRange())
                    << loopList.arrayName->sourceRange();
                indexType = &comp.getErrorType();
            }
        }
        else {
            indexType = &comp.getIntType();
        }

        // Build the iterator variable and hook it up to our new context's
        // linked list of iterators.
        auto it = comp.emplace<IteratorSymbol>(name, idName.identifier.location(), currType,
                                               *indexType);
        it->nextTemp = std::exchange(context.firstTempVar, it);
        dims.back().loopVar = it;
    }

    return &arrayRef;
}